

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_star_simplex_iterators.h
# Opt level: O2

void __thiscall
Gudhi::
Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
::increment(Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
            *this)

{
  list_node<void_*> *plVar1;
  compact_rbtree_node<void_*> *in_RAX;
  compact_rbtree_node<void_*> *local_18;
  
  local_18 = in_RAX;
  boost::iterators::
  filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
  ::increment(&this->it_);
  plVar1 = (this->it_).super_type.m_iterator.members_.nodeptr_;
  if (plVar1 == (this->end_).super_type.m_iterator.members_.nodeptr_) {
    this->st_ = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)0x0;
  }
  else {
    Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::simplex_handle_from_node
              ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)&stack0xffffffffffffffe8,
               (Node *)(plVar1 + -1));
    (this->sh_).m_iit.members_.nodeptr_ = local_18;
  }
  return;
}

Assistant:

void increment() {
    if (++it_ == end_) {
      st_ = nullptr;
    }       //== end
    else {  // update sh_
      const Node& curr_node = static_cast<const Node&>(*it_);
      sh_ = st_->simplex_handle_from_node(curr_node);
    }
  }